

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O3

bool __thiscall
duckdb::WindowDistinctAggregatorGlobalState::TryPrepareNextStage
          (WindowDistinctAggregatorGlobalState *this,WindowDistinctAggregatorLocalState *lstate)

{
  GlobalSortStatePtr *pGVar1;
  int iVar2;
  pointer pGVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  switch((this->stage)._M_i) {
  case INIT:
    this->total_tasks =
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    this->tasks_assigned = 0;
    LOCK();
    (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->stage)._M_i = SCAN;
    UNLOCK();
    bVar5 = true;
    lstate->stage = SCAN;
    this->tasks_assigned = 1;
    lstate->block_idx = 0;
    goto LAB_01798110;
  case SCAN:
    uVar4 = this->tasks_assigned;
    if (this->total_tasks <= uVar4) {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
LAB_017980f3:
        bVar5 = false;
        goto LAB_01798110;
      }
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::PrepareMergePhase(pGVar3);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        LOCK();
        (this->stage)._M_i = MERGE;
        UNLOCK();
LAB_0179814e:
        lstate->stage = MERGE;
        this->total_tasks =
             (this->super_WindowAggregatorGlobalState).locals.super___atomic_base<unsigned_long>.
             _M_i;
        this->tasks_assigned = 1;
        LOCK();
        (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        break;
      }
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if ((pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        MeasurePayloadBlocks(this);
        ::std::
        vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
        ::resize(&(this->seconds).
                  super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ,((long)(this->block_starts).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->block_starts).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) - 1);
        goto LAB_01798095;
      }
      goto switchD_01797ec9_caseD_2;
    }
    lstate->stage = SCAN;
LAB_01797f73:
    this->tasks_assigned = uVar4 + 1;
LAB_01797f7e:
    lstate->block_idx = uVar4;
    break;
  case MERGE:
    uVar4 = this->tasks_assigned;
    if (this->total_tasks <= uVar4) {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned)
      goto LAB_017980f3;
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::CompleteMergeRound(pGVar3,true);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        goto LAB_0179814e;
      }
      MeasurePayloadBlocks(this);
      ::std::
      vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
      ::resize(&(this->seconds).
                super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ,((long)(this->block_starts).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->block_starts).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) - 1);
LAB_01798095:
      this->total_tasks =
           (long)(this->seconds).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->seconds).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar4 = 0;
      LOCK();
      (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      this->tasks_assigned = 0;
      LOCK();
      (this->stage)._M_i = SORTED;
      UNLOCK();
      lstate->stage = SORTED;
      this->tasks_assigned = 1;
      goto LAB_01797f7e;
    }
    lstate->stage = MERGE;
    this->tasks_assigned = uVar4 + 1;
    break;
  case SORTED:
    uVar4 = this->tasks_assigned;
    if (uVar4 < this->total_tasks) {
      lstate->stage = SORTED;
      goto LAB_01797f73;
    }
    if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
      lstate->stage = FINISHED;
      goto LAB_017980f3;
    }
    PatchPrevIdcs(this);
  default:
switchD_01797ec9_caseD_2:
    LOCK();
    (this->stage)._M_i = FINISHED;
    UNLOCK();
    lstate->stage = FINISHED;
  }
  bVar5 = true;
LAB_01798110:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return bVar5;
}

Assistant:

bool WindowDistinctAggregatorGlobalState::TryPrepareNextStage(WindowDistinctAggregatorLocalState &lstate) {
	lock_guard<mutex> stage_guard(lock);

	switch (stage.load()) {
	case PartitionSortStage::INIT:
		//	5: Sort sorted lexicographically increasing
		total_tasks = local_sorts.size();
		tasks_assigned = 0;
		tasks_completed = 0;
		lstate.stage = stage = PartitionSortStage::SCAN;
		lstate.block_idx = tasks_assigned++;
		return true;
	case PartitionSortStage::SCAN:
		// Process all the local sorts
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::SCAN;
			lstate.block_idx = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->PrepareMergePhase();
		if (!(global_sort->sorted_blocks.size() / 2)) {
			if (global_sort->sorted_blocks.empty()) {
				lstate.stage = stage = PartitionSortStage::FINISHED;
				return true;
			}
			MeasurePayloadBlocks();
			seconds.resize(block_starts.size() - 1);
			total_tasks = seconds.size();
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.stage = stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.stage = stage = PartitionSortStage::MERGE;
		total_tasks = locals;
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::MERGE:
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::MERGE;
			++tasks_assigned;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->CompleteMergeRound(true);
		if (!(global_sort->sorted_blocks.size() / 2)) {
			MeasurePayloadBlocks();
			seconds.resize(block_starts.size() - 1);
			total_tasks = seconds.size();
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.stage = stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.stage = PartitionSortStage::MERGE;
		total_tasks = locals;
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::SORTED:
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			lstate.stage = PartitionSortStage::FINISHED;
			// Sleep while other tasks finish
			return false;
		}
		// Last task patches the boundaries
		PatchPrevIdcs();
		break;
	default:
		break;
	}

	lstate.stage = stage = PartitionSortStage::FINISHED;

	return true;
}